

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# minja.hpp
# Opt level: O0

void __thiscall
minja::SliceExpr::SliceExpr
          (SliceExpr *this,Location *loc,shared_ptr<minja::Expression> *s,
          shared_ptr<minja::Expression> *e)

{
  Expression *in_RCX;
  Location *in_RDI;
  
  Expression::Expression(in_RCX,in_RDI);
  (in_RDI->source).
  super___shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>
  ._M_ptr = (element_type *)&PTR_do_evaluate_00419bb8;
  std::shared_ptr<minja::Expression>::shared_ptr
            ((shared_ptr<minja::Expression> *)in_RCX,(shared_ptr<minja::Expression> *)in_RDI);
  std::shared_ptr<minja::Expression>::shared_ptr
            ((shared_ptr<minja::Expression> *)in_RCX,(shared_ptr<minja::Expression> *)in_RDI);
  return;
}

Assistant:

SliceExpr(const Location & loc, std::shared_ptr<Expression> && s, std::shared_ptr<Expression> && e)
      : Expression(loc), start(std::move(s)), end(std::move(e)) {}